

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_ge_x_frac_on_curve_var(secp256k1_fe *xn,secp256k1_fe *xd)

{
  uint64_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  uint64_t uVar303;
  uint64_t uVar304;
  uint64_t uVar305;
  int iVar306;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  ulong uVar307;
  ulong uVar308;
  void *pvVar309;
  ulong uVar310;
  secp256k1_gej *a;
  ulong uVar311;
  ulong uVar312;
  secp256k1_gej *psVar313;
  secp256k1_gej *psVar314;
  secp256k1_gej *a_00;
  secp256k1_gej *psVar315;
  secp256k1_gej *r;
  ulong uVar316;
  secp256k1_gej *unaff_R12;
  secp256k1_gej *psVar317;
  secp256k1_gej *unaff_R13;
  secp256k1_gej *psVar318;
  secp256k1_gej *psVar319;
  secp256k1_gej *psVar320;
  long lVar321;
  secp256k1_fe *b;
  secp256k1_gej *r_00;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_ge sStack_520;
  secp256k1_ge sStack_4b8;
  secp256k1_gej sStack_450;
  secp256k1_gej *psStack_3b8;
  secp256k1_gej *psStack_3b0;
  secp256k1_gej *psStack_3a8;
  secp256k1_gej *psStack_3a0;
  secp256k1_gej *psStack_398;
  secp256k1_gej *psStack_388;
  secp256k1_gej *psStack_380;
  ulong uStack_378;
  secp256k1_gej *psStack_370;
  secp256k1_fe *psStack_368;
  secp256k1_gej *psStack_360;
  secp256k1_gej *psStack_358;
  secp256k1_gej *psStack_350;
  ulong uStack_348;
  secp256k1_gej *psStack_340;
  secp256k1_gej *psStack_338;
  secp256k1_gej *psStack_330;
  secp256k1_gej *psStack_328;
  secp256k1_gej *psStack_320;
  secp256k1_gej *psStack_318;
  undefined1 auStack_310 [56];
  uint64_t uStack_2d8;
  uint64_t uStack_2d0;
  uint64_t uStack_2c8;
  uint64_t uStack_2c0;
  uint uStack_2b8;
  undefined1 auStack_2b0 [56];
  uint64_t uStack_278;
  uint64_t uStack_270;
  uint64_t uStack_268;
  uint64_t uStack_260;
  int iStack_258;
  undefined1 auStack_250 [56];
  uint64_t uStack_218;
  uint64_t uStack_210;
  uint64_t uStack_208;
  uint64_t uStack_200;
  int iStack_1f8;
  int iStack_1f4;
  ulong uStack_1e8;
  undefined1 auStack_1e0 [56];
  secp256k1_gej *psStack_1a8;
  secp256k1_gej *psStack_1a0;
  secp256k1_gej *psStack_198;
  ulong uStack_190;
  ulong uStack_188;
  undefined1 auStack_180 [64];
  ulong uStack_140;
  ulong uStack_138;
  ulong uStack_130;
  long lStack_128;
  uint64_t uStack_120;
  secp256k1_fe sStack_118;
  secp256k1_gej *psStack_e8;
  secp256k1_gej *psStack_e0;
  secp256k1_gej *psStack_d8;
  secp256k1_fe *psStack_d0;
  secp256k1_gej *psStack_c8;
  secp256k1_gej *psStack_c0;
  ulong local_b0;
  secp256k1_gej *local_a8;
  ulong local_a0;
  secp256k1_fe local_98;
  uint64_t local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  int local_40;
  int local_3c;
  
  b = (secp256k1_fe *)0xfffffffffffff;
  r_00 = (secp256k1_gej *)0x1000003d0;
  psStack_c0 = (secp256k1_gej *)0x12351c;
  secp256k1_fe_verify(xd);
  uVar307 = (xd->n[4] >> 0x30) * 0x1000003d1 + xd->n[0];
  if (((uVar307 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar307 & 0xfffffffffffff) == 0)) {
    uVar310 = (uVar307 >> 0x34) + xd->n[1];
    psVar314 = (secp256k1_gej *)((uVar310 >> 0x34) + xd->n[2]);
    psVar315 = (secp256k1_gej *)(((ulong)psVar314 >> 0x34) + xd->n[3]);
    uVar316 = ((ulong)psVar315 >> 0x34) + (xd->n[4] & 0xffffffffffff);
    if ((((uVar310 | uVar307 | (ulong)psVar314 | (ulong)psVar315) & 0xfffffffffffff) != 0 ||
         uVar316 != 0) &&
       (((uVar307 | 0x1000003d0) & uVar310 & (ulong)psVar314 & (ulong)psVar315 &
        (uVar316 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_001235c2;
    psStack_c0 = (secp256k1_gej *)0x123d98;
    secp256k1_ge_x_frac_on_curve_var_cold_1();
LAB_00123d98:
    psStack_c0 = (secp256k1_gej *)0x123d9d;
    secp256k1_ge_x_frac_on_curve_var_cold_6();
LAB_00123d9d:
    psStack_c0 = (secp256k1_gej *)0x123da2;
    secp256k1_ge_x_frac_on_curve_var_cold_5();
LAB_00123da2:
    psVar318 = unaff_R13;
    psVar317 = unaff_R12;
    psStack_c0 = (secp256k1_gej *)0x123da7;
    secp256k1_ge_x_frac_on_curve_var_cold_4();
LAB_00123da7:
    psStack_c0 = (secp256k1_gej *)0x123dac;
    secp256k1_ge_x_frac_on_curve_var_cold_3();
  }
  else {
LAB_001235c2:
    psStack_c0 = (secp256k1_gej *)0x1235d2;
    psVar314 = (secp256k1_gej *)xd;
    secp256k1_fe_mul((secp256k1_fe *)&stack0xffffffffffffff98,xd,xn);
    psStack_c0 = (secp256k1_gej *)0x1235da;
    psVar315 = (secp256k1_gej *)xn;
    secp256k1_fe_verify(xn);
    if (8 < xn->magnitude) goto LAB_00123d98;
    b = &local_98;
    uVar307 = xn->n[0];
    uVar310 = xn->n[1];
    unaff_R12 = (secp256k1_gej *)xn->n[2];
    unaff_R13 = (secp256k1_gej *)xn->n[3];
    uVar316 = xn->n[4];
    r_00 = (secp256k1_gej *)0xfffffffffffff;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar307 * 2;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = unaff_R13;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar310 * 2;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = unaff_R12;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar316;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar316;
    uVar308 = SUB168(auVar4 * auVar144,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar308 & 0xfffffffffffff;
    auVar2 = auVar3 * auVar143 + auVar2 * auVar142 + auVar5 * ZEXT816(0x1000003d10);
    uVar311 = auVar2._0_8_;
    local_a0 = uVar311 & 0xfffffffffffff;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uVar311 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar316 = uVar316 * 2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar307;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uVar316;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar310 * 2;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = unaff_R13;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = unaff_R12;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = unaff_R12;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar308 >> 0x34 | SUB168(auVar4 * auVar144,8) << 0xc;
    auVar2 = auVar6 * auVar145 + auVar254 + auVar7 * auVar146 + auVar8 * auVar147 +
             auVar9 * ZEXT816(0x1000003d10);
    uVar308 = auVar2._0_8_;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = uVar308 >> 0x34 | auVar2._8_8_ << 0xc;
    local_b0 = (uVar308 & 0xfffffffffffff) >> 0x30;
    local_a8 = (secp256k1_gej *)(uVar308 & 0xffffffffffff);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar307;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar307;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar310;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar316;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (long)unaff_R12 * 2;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = unaff_R13;
    auVar2 = auVar11 * auVar149 + auVar255 + auVar12 * auVar150;
    uVar308 = auVar2._0_8_;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = uVar308 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = (uVar308 & 0xfffffffffffff) << 4 | local_b0;
    auVar2 = auVar10 * auVar148 + ZEXT816(0x1000003d1) * auVar151;
    uVar308 = auVar2._0_8_;
    local_98.n[0] = uVar308 & 0xfffffffffffff;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = uVar308 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar307 * 2;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar310;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = unaff_R12;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar316;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = unaff_R13;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = unaff_R13;
    auVar3 = auVar14 * auVar153 + auVar257 + auVar15 * auVar154;
    uVar308 = auVar3._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar308 & 0xfffffffffffff;
    auVar2 = auVar13 * auVar152 + auVar256 + auVar16 * ZEXT816(0x1000003d10);
    uVar311 = auVar2._0_8_;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = uVar308 >> 0x34 | auVar3._8_8_ << 0xc;
    local_98.n[1] = uVar311 & 0xfffffffffffff;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = uVar311 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar307 * 2;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = unaff_R12;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar310;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar310;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = unaff_R13;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar316;
    auVar259 = auVar19 * auVar157 + auVar259;
    uVar307 = auVar259._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar17 * auVar155 + auVar258 + auVar18 * auVar156 + auVar20 * ZEXT816(0x1000003d10);
    uVar310 = auVar2._0_8_;
    local_98.n[2] = uVar310 & 0xfffffffffffff;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = (uVar310 >> 0x34 | auVar2._8_8_ << 0xc) + local_a0;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar307 >> 0x34 | auVar259._8_8_ << 0xc;
    auVar260 = auVar21 * ZEXT816(0x1000003d10) + auVar260;
    uVar307 = auVar260._0_8_;
    local_98.n[3] = uVar307 & 0xfffffffffffff;
    local_98.n[4] = (long)(local_a8->x).n + (uVar307 >> 0x34 | auVar260._8_8_ << 0xc);
    local_98.magnitude = 1;
    local_98.normalized = 0;
    psStack_c0 = (secp256k1_gej *)0x123824;
    secp256k1_fe_verify(b);
    psVar314 = (secp256k1_gej *)&stack0xffffffffffffff98;
    psStack_c0 = (secp256k1_gej *)0x123834;
    secp256k1_fe_mul((secp256k1_fe *)psVar314,(secp256k1_fe *)psVar314,b);
    psStack_c0 = (secp256k1_gej *)0x12383c;
    psVar315 = (secp256k1_gej *)xd;
    secp256k1_fe_verify(xd);
    xn = xd;
    if (8 < xd->magnitude) goto LAB_00123d9d;
    uVar307 = xd->n[0];
    uVar310 = xd->n[1];
    unaff_R12 = (secp256k1_gej *)xd->n[2];
    unaff_R13 = (secp256k1_gej *)xd->n[3];
    uVar316 = xd->n[4];
    r_00 = (secp256k1_gej *)0xfffffffffffff;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar307 * 2;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = unaff_R13;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar310 * 2;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = unaff_R12;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar316;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar316;
    uVar308 = SUB168(auVar24 * auVar160,0);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar308 & 0xfffffffffffff;
    auVar2 = auVar23 * auVar159 + auVar22 * auVar158 + auVar25 * ZEXT816(0x1000003d10);
    uVar311 = auVar2._0_8_;
    local_a0 = uVar311 & 0xfffffffffffff;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = uVar311 >> 0x34 | auVar2._8_8_ << 0xc;
    b = (secp256k1_fe *)(uVar316 * 2);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar307;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = b;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar310 * 2;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = unaff_R13;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = unaff_R12;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = unaff_R12;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar308 >> 0x34 | SUB168(auVar24 * auVar160,8) << 0xc;
    auVar2 = auVar26 * auVar161 + auVar261 + auVar27 * auVar162 + auVar28 * auVar163 +
             auVar29 * ZEXT816(0x1000003d10);
    uVar316 = auVar2._0_8_;
    auVar262._8_8_ = 0;
    auVar262._0_8_ = uVar316 >> 0x34 | auVar2._8_8_ << 0xc;
    local_b0 = (uVar316 & 0xfffffffffffff) >> 0x30;
    psVar314 = (secp256k1_gej *)(uVar316 & 0xffffffffffff);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar307;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar307;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar310;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = b;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (long)unaff_R12 * 2;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = unaff_R13;
    auVar2 = auVar31 * auVar165 + auVar262 + auVar32 * auVar166;
    uVar316 = auVar2._0_8_;
    auVar264._8_8_ = 0;
    auVar264._0_8_ = uVar316 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = (uVar316 & 0xfffffffffffff) << 4 | local_b0;
    auVar2 = auVar30 * auVar164 + ZEXT816(0x1000003d1) * auVar167;
    uVar316 = auVar2._0_8_;
    local_98.n[0] = uVar316 & 0xfffffffffffff;
    auVar263._8_8_ = 0;
    auVar263._0_8_ = uVar316 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar307 * 2;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar310;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = unaff_R12;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = b;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = unaff_R13;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = unaff_R13;
    auVar3 = auVar34 * auVar169 + auVar264 + auVar35 * auVar170;
    uVar316 = auVar3._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar316 & 0xfffffffffffff;
    auVar2 = auVar33 * auVar168 + auVar263 + auVar36 * ZEXT816(0x1000003d10);
    uVar308 = auVar2._0_8_;
    auVar266._8_8_ = 0;
    auVar266._0_8_ = uVar316 >> 0x34 | auVar3._8_8_ << 0xc;
    local_98.n[1] = uVar308 & 0xfffffffffffff;
    auVar265._8_8_ = 0;
    auVar265._0_8_ = uVar308 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar307 * 2;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = unaff_R12;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar310;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar310;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = unaff_R13;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = b;
    auVar266 = auVar39 * auVar173 + auVar266;
    uVar307 = auVar266._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar37 * auVar171 + auVar265 + auVar38 * auVar172 + auVar40 * ZEXT816(0x1000003d10);
    uVar310 = auVar2._0_8_;
    xn = (secp256k1_fe *)(uVar307 >> 0x34 | auVar266._8_8_ << 0xc);
    local_98.n[2] = uVar310 & 0xfffffffffffff;
    auVar267._8_8_ = 0;
    auVar267._0_8_ = (uVar310 >> 0x34 | auVar2._8_8_ << 0xc) + local_a0;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = xn;
    auVar267 = auVar41 * ZEXT816(0x1000003d10) + auVar267;
    uVar307 = auVar267._0_8_;
    local_98.n[3] = uVar307 & 0xfffffffffffff;
    local_98.n[4] = (long)(psVar314->x).n + (uVar307 >> 0x34 | auVar267._8_8_ << 0xc);
    local_98.magnitude = 1;
    local_98.normalized = 0;
    psStack_c0 = (secp256k1_gej *)0x123a83;
    local_a8 = psVar314;
    secp256k1_fe_verify(&local_98);
    psStack_c0 = (secp256k1_gej *)0x123a8b;
    psVar315 = (secp256k1_gej *)&local_98;
    secp256k1_fe_verify(&local_98);
    psVar318 = (secp256k1_gej *)local_98.n[3];
    psVar317 = (secp256k1_gej *)local_98.n[2];
    xd = &local_98;
    if (8 < local_98.magnitude) goto LAB_00123da2;
    r_00 = (secp256k1_gej *)0xfffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_98.n[0] * 2;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = local_98.n[3];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_98.n[1] * 2;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = local_98.n[2];
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_98.n[4];
    auVar176._8_8_ = 0;
    auVar176._0_8_ = local_98.n[4];
    uVar307 = SUB168(auVar44 * auVar176,0);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar43 * auVar175 + auVar42 * auVar174 + auVar45 * ZEXT816(0x1000003d10);
    uVar310 = auVar2._0_8_;
    local_a0 = uVar310 & 0xfffffffffffff;
    auVar268._8_8_ = 0;
    auVar268._0_8_ = uVar310 >> 0x34 | auVar2._8_8_ << 0xc;
    b = (secp256k1_fe *)(local_98.n[4] * 2);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_98.n[0];
    auVar177._8_8_ = 0;
    auVar177._0_8_ = b;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_98.n[1] * 2;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = local_98.n[3];
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_98.n[2];
    auVar179._8_8_ = 0;
    auVar179._0_8_ = local_98.n[2];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar307 >> 0x34 | SUB168(auVar44 * auVar176,8) << 0xc;
    auVar2 = auVar46 * auVar177 + auVar268 + auVar47 * auVar178 + auVar48 * auVar179 +
             auVar49 * ZEXT816(0x1000003d10);
    uVar307 = auVar2._0_8_;
    auVar269._8_8_ = 0;
    auVar269._0_8_ = uVar307 >> 0x34 | auVar2._8_8_ << 0xc;
    local_b0 = (uVar307 & 0xfffffffffffff) >> 0x30;
    psVar314 = (secp256k1_gej *)(uVar307 & 0xffffffffffff);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_98.n[0];
    auVar180._8_8_ = 0;
    auVar180._0_8_ = local_98.n[0];
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_98.n[1];
    auVar181._8_8_ = 0;
    auVar181._0_8_ = b;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_98.n[2] * 2;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = local_98.n[3];
    auVar2 = auVar51 * auVar181 + auVar269 + auVar52 * auVar182;
    uVar307 = auVar2._0_8_;
    auVar271._8_8_ = 0;
    auVar271._0_8_ = uVar307 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = (uVar307 & 0xfffffffffffff) << 4 | local_b0;
    auVar2 = auVar50 * auVar180 + ZEXT816(0x1000003d1) * auVar183;
    uVar310 = auVar2._0_8_;
    auVar270._8_8_ = 0;
    auVar270._0_8_ = uVar310 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_98.n[0] * 2;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = local_98.n[1];
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_98.n[2];
    auVar185._8_8_ = 0;
    auVar185._0_8_ = b;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_98.n[3];
    auVar186._8_8_ = 0;
    auVar186._0_8_ = local_98.n[3];
    auVar3 = auVar54 * auVar185 + auVar271 + auVar55 * auVar186;
    uVar307 = auVar3._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar53 * auVar184 + auVar270 + auVar56 * ZEXT816(0x1000003d10);
    uVar316 = auVar2._0_8_;
    auVar273._8_8_ = 0;
    auVar273._0_8_ = uVar307 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar272._8_8_ = 0;
    auVar272._0_8_ = uVar316 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_98.n[0] * 2;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = local_98.n[2];
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_98.n[1];
    auVar188._8_8_ = 0;
    auVar188._0_8_ = local_98.n[1];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = local_98.n[3];
    auVar189._8_8_ = 0;
    auVar189._0_8_ = b;
    auVar273 = auVar59 * auVar189 + auVar273;
    uVar307 = auVar273._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar57 * auVar187 + auVar272 + auVar58 * auVar188 + auVar60 * ZEXT816(0x1000003d10);
    uVar308 = auVar2._0_8_;
    xn = (secp256k1_fe *)(uVar307 >> 0x34 | auVar273._8_8_ << 0xc);
    local_98.n[2] = uVar308 & 0xfffffffffffff;
    auVar274._8_8_ = 0;
    auVar274._0_8_ = (uVar308 >> 0x34 | auVar2._8_8_ << 0xc) + local_a0;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = xn;
    auVar274 = auVar61 * ZEXT816(0x1000003d10) + auVar274;
    uVar307 = auVar274._0_8_;
    local_98.n[3] = uVar307 & 0xfffffffffffff;
    local_98.n[4] = (long)(psVar314->x).n + (uVar307 >> 0x34 | auVar274._8_8_ << 0xc);
    local_98.magnitude = 1;
    local_98.normalized = 0;
    psStack_c0 = (secp256k1_gej *)0x123cce;
    local_a8 = psVar314;
    local_98.n[0] = uVar310 & 0xfffffffffffff;
    local_98.n[1] = uVar316 & 0xfffffffffffff;
    secp256k1_fe_verify(&local_98);
    psStack_c0 = (secp256k1_gej *)0x123cd6;
    psVar315 = (secp256k1_gej *)&local_98;
    secp256k1_fe_verify(&local_98);
    if (0x10 < local_98.magnitude) goto LAB_00123da7;
    xn = &local_98;
    local_98.n[0] = local_98.n[0] * 2;
    local_98.n[1] = local_98.n[1] * 2;
    local_98.n[2] = local_98.n[2] * 2;
    local_98.n[3] = local_98.n[3] * 2;
    local_98.n[4] = local_98.n[4] << 1;
    local_98.normalized = 0;
    local_98.magnitude = local_98.magnitude * 2;
    psStack_c0 = (secp256k1_gej *)0x123d1a;
    secp256k1_fe_verify(xn);
    b = (secp256k1_fe *)&stack0xffffffffffffff98;
    psStack_c0 = (secp256k1_gej *)0x123d27;
    secp256k1_fe_verify(b);
    psStack_c0 = (secp256k1_gej *)0x123d2f;
    psVar315 = (secp256k1_gej *)xn;
    secp256k1_fe_verify(xn);
    local_40 = local_98.magnitude + local_40;
    if (local_40 < 0x21) {
      local_68 = local_68 + local_98.n[0];
      uStack_60 = uStack_60 + local_98.n[1];
      local_58 = (long)((secp256k1_fe *)local_98.n[2])->n + local_58;
      uStack_50 = (long)((secp256k1_fe *)local_98.n[3])->n + uStack_50;
      local_48 = local_48 + local_98.n[4];
      local_3c = 0;
      psStack_c0 = (secp256k1_gej *)0x123d79;
      secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffff98);
      psStack_c0 = (secp256k1_gej *)0x123d81;
      iVar306 = secp256k1_fe_is_square_var((secp256k1_fe *)&stack0xffffffffffffff98);
      return iVar306;
    }
  }
  psStack_c0 = (secp256k1_gej *)secp256k1_gej_add_var;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psStack_398 = (secp256k1_gej *)0x123dd3;
  a_00 = psVar314;
  psStack_e8 = (secp256k1_gej *)xn;
  psStack_e0 = psVar317;
  psStack_d8 = psVar318;
  psStack_d0 = b;
  psStack_c8 = r_00;
  psStack_c0 = (secp256k1_gej *)xd;
  secp256k1_gej_verify(psVar314);
  psStack_398 = (secp256k1_gej *)0x123ddb;
  secp256k1_gej_verify(a);
  psVar313 = a;
  if ((psVar314->infinity != 0) || (psVar313 = psVar314, a->infinity != 0)) {
    pvVar309 = memcpy(psVar315,psVar313,0x98);
    return (int)pvVar309;
  }
  psVar313 = (secp256k1_gej *)&a->z;
  psStack_398 = (secp256k1_gej *)0x123e32;
  r = psVar313;
  psStack_388 = psVar315;
  psStack_380 = psVar314;
  secp256k1_fe_verify((secp256k1_fe *)psVar313);
  if ((a->z).magnitude < 9) {
    uVar307 = ((secp256k1_fe *)psVar313)->n[0];
    uVar310 = (a->z).n[1];
    psVar317 = (secp256k1_gej *)(a->z).n[2];
    psVar318 = (secp256k1_gej *)(a->z).n[3];
    uVar316 = (a->z).n[4];
    r_00 = (secp256k1_gej *)0xfffffffffffff;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar307 * 2;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = psVar318;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar310 * 2;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = psVar317;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar316;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar316;
    uVar308 = SUB168(auVar64 * auVar192,0);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar308 & 0xfffffffffffff;
    auVar2 = auVar63 * auVar191 + auVar62 * auVar190 + auVar65 * ZEXT816(0x1000003d10);
    uVar311 = auVar2._0_8_;
    auStack_180._56_8_ = uVar311 & 0xfffffffffffff;
    auVar275._8_8_ = 0;
    auVar275._0_8_ = uVar311 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar316 = uVar316 * 2;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar307;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = uVar316;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar310 * 2;
    auVar194._8_8_ = 0;
    auVar194._0_8_ = psVar318;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = psVar317;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = psVar317;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar308 >> 0x34 | SUB168(auVar64 * auVar192,8) << 0xc;
    auVar2 = auVar66 * auVar193 + auVar275 + auVar67 * auVar194 + auVar68 * auVar195 +
             auVar69 * ZEXT816(0x1000003d10);
    uVar308 = auVar2._0_8_;
    auVar276._8_8_ = 0;
    auVar276._0_8_ = uVar308 >> 0x34 | auVar2._8_8_ << 0xc;
    auStack_2b0._0_8_ = (uVar308 & 0xfffffffffffff) >> 0x30;
    a_00 = (secp256k1_gej *)(uVar308 & 0xffffffffffff);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar307;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = uVar307;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar310;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = uVar316;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = (long)psVar317 * 2;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = psVar318;
    auVar2 = auVar71 * auVar197 + auVar276 + auVar72 * auVar198;
    uVar308 = auVar2._0_8_;
    auVar278._8_8_ = 0;
    auVar278._0_8_ = uVar308 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = (uVar308 & 0xfffffffffffff) << 4 | auStack_2b0._0_8_;
    auVar2 = auVar70 * auVar196 + ZEXT816(0x1000003d1) * auVar199;
    uVar308 = auVar2._0_8_;
    sStack_118.n[0] = uVar308 & 0xfffffffffffff;
    auVar277._8_8_ = 0;
    auVar277._0_8_ = uVar308 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar307 * 2;
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar310;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = psVar317;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = uVar316;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = psVar318;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = psVar318;
    auVar3 = auVar74 * auVar201 + auVar278 + auVar75 * auVar202;
    uVar308 = auVar3._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar308 & 0xfffffffffffff;
    auVar2 = auVar73 * auVar200 + auVar277 + auVar76 * ZEXT816(0x1000003d10);
    uVar311 = auVar2._0_8_;
    auVar280._8_8_ = 0;
    auVar280._0_8_ = uVar308 >> 0x34 | auVar3._8_8_ << 0xc;
    sStack_118.n[1] = uVar311 & 0xfffffffffffff;
    auVar279._8_8_ = 0;
    auVar279._0_8_ = uVar311 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar307 * 2;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = psVar317;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar310;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar310;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = psVar318;
    auVar205._8_8_ = 0;
    auVar205._0_8_ = uVar316;
    auVar280 = auVar79 * auVar205 + auVar280;
    uVar307 = auVar280._0_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar77 * auVar203 + auVar279 + auVar78 * auVar204 + auVar80 * ZEXT816(0x1000003d10);
    uVar310 = auVar2._0_8_;
    sStack_118.n[2] = uVar310 & 0xfffffffffffff;
    auVar281._8_8_ = 0;
    auVar281._0_8_ = (uVar310 >> 0x34 | auVar2._8_8_ << 0xc) + auStack_180._56_8_;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar307 >> 0x34 | auVar280._8_8_ << 0xc;
    auVar281 = auVar81 * ZEXT816(0x1000003d10) + auVar281;
    uVar307 = auVar281._0_8_;
    sStack_118.n[3] = uVar307 & 0xfffffffffffff;
    sStack_118.n[4] = (long)(a_00->x).n + (uVar307 >> 0x34 | auVar281._8_8_ << 0xc);
    sStack_118.magnitude = 1;
    sStack_118.normalized = 0;
    psStack_398 = (secp256k1_gej *)0x124093;
    psStack_368 = (secp256k1_fe *)psVar313;
    auStack_2b0._48_8_ = a_00;
    secp256k1_fe_verify(&sStack_118);
    psVar314 = psStack_380;
    psVar313 = (secp256k1_gej *)&psStack_380->z;
    psStack_398 = (secp256k1_gej *)0x1240a4;
    r = psVar313;
    secp256k1_fe_verify((secp256k1_fe *)psVar313);
    if (8 < (psVar314->z).magnitude) goto LAB_00124f4e;
    psVar317 = (secp256k1_gej *)(auStack_180 + 0x38);
    uVar307 = ((secp256k1_fe *)psVar313)->n[0];
    uVar310 = (psVar314->z).n[1];
    uVar316 = (psVar314->z).n[2];
    psVar318 = (secp256k1_gej *)(psVar314->z).n[3];
    uVar308 = (psVar314->z).n[4];
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar307 * 2;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = psVar318;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar310 * 2;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uVar316;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar308;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar308;
    uVar311 = SUB168(auVar84 * auVar208,0);
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar311 & 0xfffffffffffff;
    auVar2 = auVar83 * auVar207 + auVar82 * auVar206 + auVar85 * ZEXT816(0x1000003d10);
    uVar312 = auVar2._0_8_;
    auStack_2b0._48_8_ = uVar312 & 0xfffffffffffff;
    auVar282._8_8_ = 0;
    auVar282._0_8_ = uVar312 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar308 = uVar308 * 2;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar307;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar308;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar310 * 2;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = psVar318;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar316;
    auVar211._8_8_ = 0;
    auVar211._0_8_ = uVar316;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar311 >> 0x34 | SUB168(auVar84 * auVar208,8) << 0xc;
    auVar2 = auVar86 * auVar209 + auVar282 + auVar87 * auVar210 + auVar88 * auVar211 +
             auVar89 * ZEXT816(0x1000003d10);
    auStack_2b0._0_8_ = auVar2._0_8_;
    auVar283._8_8_ = 0;
    auVar283._0_8_ = (ulong)auStack_2b0._0_8_ >> 0x34 | auVar2._8_8_ << 0xc;
    auStack_310._48_8_ = (auStack_2b0._0_8_ & 0xfffffffffffff) >> 0x30;
    auStack_2b0._0_8_ = auStack_2b0._0_8_ & 0xffffffffffff;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar307;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = uVar307;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar310;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = uVar308;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar316 * 2;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = psVar318;
    auVar2 = auVar91 * auVar213 + auVar283 + auVar92 * auVar214;
    uVar311 = auVar2._0_8_;
    auVar285._8_8_ = 0;
    auVar285._0_8_ = uVar311 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = (uVar311 & 0xfffffffffffff) << 4 | auStack_310._48_8_;
    auVar2 = auVar90 * auVar212 + ZEXT816(0x1000003d1) * auVar215;
    uVar311 = auVar2._0_8_;
    auStack_180._56_8_ = uVar311 & 0xfffffffffffff;
    auVar284._8_8_ = 0;
    auVar284._0_8_ = uVar311 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar307 * 2;
    auVar216._8_8_ = 0;
    auVar216._0_8_ = uVar310;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar316;
    auVar217._8_8_ = 0;
    auVar217._0_8_ = uVar308;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = psVar318;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = psVar318;
    auVar3 = auVar94 * auVar217 + auVar285 + auVar95 * auVar218;
    uVar311 = auVar3._0_8_;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar311 & 0xfffffffffffff;
    auVar2 = auVar93 * auVar216 + auVar284 + auVar96 * ZEXT816(0x1000003d10);
    uVar312 = auVar2._0_8_;
    auVar287._8_8_ = 0;
    auVar287._0_8_ = uVar311 >> 0x34 | auVar3._8_8_ << 0xc;
    uStack_140 = uVar312 & 0xfffffffffffff;
    auVar286._8_8_ = 0;
    auVar286._0_8_ = uVar312 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar307 * 2;
    auVar219._8_8_ = 0;
    auVar219._0_8_ = uVar316;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar310;
    auVar220._8_8_ = 0;
    auVar220._0_8_ = uVar310;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = psVar318;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = uVar308;
    auVar287 = auVar99 * auVar221 + auVar287;
    uVar307 = auVar287._0_8_;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar97 * auVar219 + auVar286 + auVar98 * auVar220 + auVar100 * ZEXT816(0x1000003d10);
    uVar310 = auVar2._0_8_;
    uStack_138 = uVar310 & 0xfffffffffffff;
    auVar288._8_8_ = 0;
    auVar288._0_8_ =
         (long)(((secp256k1_gej *)auStack_2b0._48_8_)->x).n +
         (uVar310 >> 0x34 | auVar2._8_8_ << 0xc);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar307 >> 0x34 | auVar287._8_8_ << 0xc;
    auVar288 = auVar101 * ZEXT816(0x1000003d10) + auVar288;
    uVar307 = auVar288._0_8_;
    uStack_130 = uVar307 & 0xfffffffffffff;
    lStack_128 = (uVar307 >> 0x34 | auVar288._8_8_ << 0xc) + auStack_2b0._0_8_;
    uStack_120 = 1;
    psStack_398 = (secp256k1_gej *)0x124309;
    psStack_370 = psVar313;
    secp256k1_fe_verify((secp256k1_fe *)psVar317);
    psVar314 = psStack_380;
    psVar313 = (secp256k1_gej *)(auStack_2b0 + 0x30);
    psStack_398 = (secp256k1_gej *)0x12432c;
    secp256k1_fe_mul((secp256k1_fe *)psVar313,&psStack_380->x,&sStack_118);
    psStack_398 = (secp256k1_gej *)0x12433f;
    secp256k1_fe_mul((secp256k1_fe *)auStack_2b0,&a->x,(secp256k1_fe *)psVar317);
    r_00 = (secp256k1_gej *)(auStack_310 + 0x30);
    psStack_398 = (secp256k1_gej *)0x124356;
    secp256k1_fe_mul((secp256k1_fe *)r_00,&psVar314->y,&sStack_118);
    psStack_398 = (secp256k1_gej *)0x124366;
    secp256k1_fe_mul((secp256k1_fe *)r_00,(secp256k1_fe *)r_00,psStack_368);
    psVar314 = (secp256k1_gej *)auStack_250;
    psStack_398 = (secp256k1_gej *)0x124380;
    secp256k1_fe_mul((secp256k1_fe *)psVar314,&a->y,(secp256k1_fe *)psVar317);
    psStack_398 = (secp256k1_gej *)0x124390;
    a_00 = psVar314;
    secp256k1_fe_mul((secp256k1_fe *)psVar314,(secp256k1_fe *)psVar314,&psStack_370->x);
    psStack_398 = (secp256k1_gej *)0x124398;
    r = psVar313;
    secp256k1_fe_verify((secp256k1_fe *)psVar313);
    if (1 < iStack_258) goto LAB_00124f53;
    r_00 = (secp256k1_gej *)(0x3ffffbfffff0bc - auStack_2b0._48_8_);
    psVar317 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_278);
    psVar318 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_270);
    psVar314 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_268);
    uStack_188 = 2;
    psStack_398 = (secp256k1_gej *)0x124419;
    auStack_1e0._48_8_ = r_00;
    psStack_1a8 = psVar317;
    psStack_1a0 = psVar318;
    psStack_198 = psVar314;
    uStack_190 = 0x3fffffffffffc - uStack_260;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1e0 + 0x30));
    psStack_398 = (secp256k1_gej *)0x124421;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1e0 + 0x30));
    psVar313 = (secp256k1_gej *)auStack_2b0;
    psStack_398 = (secp256k1_gej *)0x124431;
    r = psVar313;
    secp256k1_fe_verify((secp256k1_fe *)psVar313);
    if (0x1e < (int)auStack_2b0._40_4_) goto LAB_00124f58;
    r_00 = (secp256k1_gej *)((long)(r_00->x).n + auStack_2b0._0_8_);
    psVar317 = (secp256k1_gej *)((long)(psVar317->x).n + auStack_2b0._8_8_);
    psVar318 = (secp256k1_gej *)((long)(psVar318->x).n + auStack_2b0._16_8_);
    psVar314 = (secp256k1_gej *)((long)(psVar314->x).n + auStack_2b0._24_8_);
    uStack_378 = (0x3fffffffffffc - uStack_260) + auStack_2b0._32_8_;
    uStack_188 = (ulong)(auStack_2b0._40_4_ + 2);
    psStack_398 = (secp256k1_gej *)0x1244ab;
    psStack_340 = psVar318;
    psStack_338 = psVar314;
    psStack_330 = r_00;
    psStack_328 = psVar317;
    auStack_1e0._48_8_ = r_00;
    psStack_1a8 = psVar317;
    psStack_1a0 = psVar318;
    psStack_198 = psVar314;
    uStack_190 = uStack_378;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1e0 + 0x30));
    psVar313 = (secp256k1_gej *)auStack_250;
    psStack_398 = (secp256k1_gej *)0x1244bb;
    r = psVar313;
    secp256k1_fe_verify((secp256k1_fe *)psVar313);
    if (1 < (int)auStack_250._40_4_) goto LAB_00124f5d;
    psVar314 = (secp256k1_gej *)(0x3ffffbfffff0bc - auStack_250._0_8_);
    r_00 = (secp256k1_gej *)(0x3ffffffffffffc - auStack_250._8_8_);
    psVar317 = (secp256k1_gej *)(0x3ffffffffffffc - auStack_250._16_8_);
    psVar318 = (secp256k1_gej *)(0x3fffffffffffc - auStack_250._32_8_);
    auStack_1e0._40_8_ = 2;
    psStack_398 = (secp256k1_gej *)0x12453c;
    auStack_1e0._0_8_ = psVar314;
    auStack_1e0._8_8_ = r_00;
    auStack_1e0._16_8_ = psVar317;
    auStack_1e0._24_8_ = (secp256k1_gej *)(0x3ffffffffffffc - auStack_250._24_8_);
    auStack_1e0._32_8_ = psVar318;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1e0);
    psStack_398 = (secp256k1_gej *)0x124544;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1e0);
    psVar313 = (secp256k1_gej *)(auStack_310 + 0x30);
    psStack_398 = (secp256k1_gej *)0x124554;
    r = psVar313;
    secp256k1_fe_verify((secp256k1_fe *)psVar313);
    if (0x1e < (int)uStack_2b8) goto LAB_00124f62;
    psStack_350 = (secp256k1_gej *)((long)(psVar314->x).n + auStack_310._48_8_);
    psStack_358 = (secp256k1_gej *)((long)(r_00->x).n + uStack_2d8);
    psVar317 = (secp256k1_gej *)((long)(psVar317->x).n + uStack_2d0);
    psVar314 = (secp256k1_gej *)
               ((long)(((secp256k1_gej *)(0x3ffffffffffffc - auStack_250._24_8_))->x).n + uStack_2c8
               );
    psVar318 = (secp256k1_gej *)((long)(psVar318->x).n + uStack_2c0);
    auStack_1e0._44_4_ = 0;
    auStack_1e0._40_4_ = uStack_2b8 + 2;
    psStack_398 = (secp256k1_gej *)0x1245d3;
    psStack_360 = psVar317;
    uStack_348 = (ulong)uStack_2b8;
    auStack_1e0._0_8_ = psStack_350;
    auStack_1e0._8_8_ = psStack_358;
    auStack_1e0._16_8_ = psVar317;
    auStack_1e0._24_8_ = psVar314;
    auStack_1e0._32_8_ = psVar318;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1e0);
    psStack_398 = (secp256k1_gej *)0x1245e0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1e0 + 0x30));
    r_00 = psStack_388;
    uVar307 = (uStack_378 >> 0x30) * 0x1000003d1 + (long)psStack_330;
    if (((uVar307 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar307 & 0xfffffffffffff) == 0)) {
      uVar311 = (long)(psStack_328->x).n + (uVar307 >> 0x34);
      uVar310 = (long)(psStack_340->x).n + (uVar311 >> 0x34);
      uVar316 = (long)(psStack_338->x).n + (uVar310 >> 0x34);
      uVar308 = (uVar316 >> 0x34) + (uStack_378 & 0xffffffffffff);
      if ((((uVar311 | uVar307 | uVar310 | uVar316) & 0xfffffffffffff) == 0 && uVar308 == 0) ||
         (((uVar307 | 0x1000003d0) & uVar311 & uVar310 & uVar316 & (uVar308 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_398 = (secp256k1_gej *)0x124e86;
        secp256k1_fe_verify((secp256k1_fe *)auStack_1e0);
        uVar307 = ((ulong)psVar318 >> 0x30) * 0x1000003d1 + (long)psStack_350;
        if (((uVar307 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar307 & 0xfffffffffffff) == 0))
        {
          uVar311 = (long)(psStack_358->x).n + (uVar307 >> 0x34);
          uVar310 = (long)(psStack_360->x).n + (uVar311 >> 0x34);
          uVar316 = (long)(psVar314->x).n + (uVar310 >> 0x34);
          uVar308 = (uVar316 >> 0x34) + ((ulong)psVar318 & 0xffffffffffff);
          if ((((uVar311 | uVar307 | uVar310 | uVar316) & 0xfffffffffffff) == 0 && uVar308 == 0) ||
             (((uVar307 | 0x1000003d0) & uVar311 & uVar310 & uVar316 & (uVar308 ^ 0xf000000000000))
              == 0xfffffffffffff)) {
            psStack_398 = (secp256k1_gej *)0x124f37;
            secp256k1_gej_double_var(psStack_388,psStack_380,(secp256k1_fe *)0x0);
            return extraout_EAX_01;
          }
        }
        psStack_398 = (secp256k1_gej *)0x124f24;
        secp256k1_gej_set_infinity(psStack_388);
        return extraout_EAX_00;
      }
    }
    psStack_388->infinity = 0;
    psVar314 = (secp256k1_gej *)(auStack_250 + 0x30);
    psVar313 = (secp256k1_gej *)(auStack_1e0 + 0x30);
    psStack_398 = (secp256k1_gej *)0x1246cf;
    secp256k1_fe_mul((secp256k1_fe *)psVar314,(secp256k1_fe *)psVar313,psStack_368);
    psStack_398 = (secp256k1_gej *)0x1246e0;
    a_00 = psStack_370;
    secp256k1_fe_mul(&r_00->z,&psStack_370->x,(secp256k1_fe *)psVar314);
    psStack_398 = (secp256k1_gej *)0x1246e8;
    r = psVar313;
    secp256k1_fe_verify((secp256k1_fe *)psVar313);
    psVar319 = psStack_198;
    psVar315 = psStack_1a0;
    if (8 < (int)uStack_188) goto LAB_00124f67;
    r = (secp256k1_gej *)auStack_180;
    r_00 = (secp256k1_gej *)0xfffffffffffff;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = auStack_1e0._48_8_ * 2;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = psStack_198;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = (long)psStack_1a8 * 2;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = psStack_1a0;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uStack_190;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = uStack_190;
    uVar307 = SUB168(auVar104 * auVar224,0);
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar103 * auVar223 + auVar102 * auVar222 + auVar105 * ZEXT816(0x1000003d10);
    uVar310 = auVar2._0_8_;
    auStack_310._0_8_ = uVar310 & 0xfffffffffffff;
    auVar289._8_8_ = 0;
    auVar289._0_8_ = uVar310 >> 0x34 | auVar2._8_8_ << 0xc;
    psVar314 = (secp256k1_gej *)(uStack_190 * 2);
    auVar106._8_8_ = 0;
    auVar106._0_8_ = auStack_1e0._48_8_;
    auVar225._8_8_ = 0;
    auVar225._0_8_ = psVar314;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = (long)psStack_1a8 * 2;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = psStack_198;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = psStack_1a0;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = psStack_1a0;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar307 >> 0x34 | SUB168(auVar104 * auVar224,8) << 0xc;
    auVar2 = auVar106 * auVar225 + auVar289 + auVar107 * auVar226 + auVar108 * auVar227 +
             auVar109 * ZEXT816(0x1000003d10);
    uVar307 = auVar2._0_8_;
    auVar290._8_8_ = 0;
    auVar290._0_8_ = uVar307 >> 0x34 | auVar2._8_8_ << 0xc;
    psStack_320 = (secp256k1_gej *)((uVar307 & 0xfffffffffffff) >> 0x30);
    a_00 = (secp256k1_gej *)(uVar307 & 0xffffffffffff);
    auVar110._8_8_ = 0;
    auVar110._0_8_ = auStack_1e0._48_8_;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = auStack_1e0._48_8_;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = psStack_1a8;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = psVar314;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = (long)psStack_1a0 * 2;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = psStack_198;
    auVar2 = auVar111 * auVar229 + auVar290 + auVar112 * auVar230;
    uVar307 = auVar2._0_8_;
    auVar292._8_8_ = 0;
    auVar292._0_8_ = uVar307 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = (uVar307 & 0xfffffffffffff) << 4 | (ulong)psStack_320;
    auVar2 = auVar110 * auVar228 + ZEXT816(0x1000003d1) * auVar231;
    uVar307 = auVar2._0_8_;
    auStack_180._0_8_ = uVar307 & 0xfffffffffffff;
    auVar291._8_8_ = 0;
    auVar291._0_8_ = uVar307 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = auStack_1e0._48_8_ * 2;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = psStack_1a8;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = psStack_1a0;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = psVar314;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = psStack_198;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = psStack_198;
    auVar3 = auVar114 * auVar233 + auVar292 + auVar115 * auVar234;
    uVar307 = auVar3._0_8_;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar113 * auVar232 + auVar291 + auVar116 * ZEXT816(0x1000003d10);
    uVar310 = auVar2._0_8_;
    auVar294._8_8_ = 0;
    auVar294._0_8_ = uVar307 >> 0x34 | auVar3._8_8_ << 0xc;
    auStack_180._8_8_ = uVar310 & 0xfffffffffffff;
    auVar293._8_8_ = 0;
    auVar293._0_8_ = uVar310 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = auStack_1e0._48_8_ * 2;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = psStack_1a0;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = psStack_1a8;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = psStack_1a8;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = psStack_198;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = psVar314;
    auVar294 = auVar119 * auVar237 + auVar294;
    uVar307 = auVar294._0_8_;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar117 * auVar235 + auVar293 + auVar118 * auVar236 + auVar120 * ZEXT816(0x1000003d10)
    ;
    uVar310 = auVar2._0_8_;
    psVar313 = (secp256k1_gej *)(uVar307 >> 0x34 | auVar294._8_8_ << 0xc);
    auStack_180._16_8_ = uVar310 & 0xfffffffffffff;
    auVar295._8_8_ = 0;
    auVar295._0_8_ = (uVar310 >> 0x34 | auVar2._8_8_ << 0xc) + auStack_310._0_8_;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = psVar313;
    auVar295 = auVar121 * ZEXT816(0x1000003d10) + auVar295;
    uVar307 = auVar295._0_8_;
    auStack_180._24_8_ = uVar307 & 0xfffffffffffff;
    auStack_180._32_8_ = (long)(a_00->x).n + (uVar307 >> 0x34 | auVar295._8_8_ << 0xc);
    auStack_180._40_4_ = 1;
    auStack_180._44_4_ = 0;
    psStack_398 = (secp256k1_gej *)0x124938;
    psStack_318 = a_00;
    secp256k1_fe_verify((secp256k1_fe *)r);
    psStack_398 = (secp256k1_gej *)0x124940;
    secp256k1_fe_verify((secp256k1_fe *)r);
    if (1 < (int)auStack_180._40_4_) goto LAB_00124f6c;
    auStack_180._0_8_ = 0x3ffffbfffff0bc - auStack_180._0_8_;
    auStack_180._8_8_ = 0x3ffffffffffffc - auStack_180._8_8_;
    auStack_180._16_8_ = 0x3ffffffffffffc - auStack_180._16_8_;
    auStack_180._24_8_ = 0x3ffffffffffffc - auStack_180._24_8_;
    auStack_180._32_8_ = 0x3fffffffffffc - auStack_180._32_8_;
    auStack_180._40_4_ = 2;
    auStack_180._44_4_ = 0;
    psStack_398 = (secp256k1_gej *)0x124996;
    secp256k1_fe_verify((secp256k1_fe *)auStack_180);
    psStack_398 = (secp256k1_gej *)0x1249ae;
    secp256k1_fe_mul((secp256k1_fe *)auStack_310,(secp256k1_fe *)auStack_180,
                     (secp256k1_fe *)(auStack_1e0 + 0x30));
    a_00 = (secp256k1_gej *)(auStack_2b0 + 0x30);
    psStack_398 = (secp256k1_gej *)0x1249c6;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_250 + 0x30),(secp256k1_fe *)a_00,
                     (secp256k1_fe *)auStack_180);
    psVar313 = (secp256k1_gej *)auStack_1e0;
    psStack_398 = (secp256k1_gej *)0x1249d6;
    secp256k1_fe_verify((secp256k1_fe *)psVar313);
    psVar320 = (secp256k1_gej *)auStack_1e0._24_8_;
    psVar318 = (secp256k1_gej *)auStack_1e0._16_8_;
    psVar317 = psStack_388;
    r = psStack_388;
    if (6 < (int)uStack_348) goto LAB_00124f71;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = auStack_1e0._0_8_ * 2;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = auStack_1e0._24_8_;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = auStack_1e0._8_8_ * 2;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = auStack_1e0._16_8_;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = auStack_1e0._32_8_;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = auStack_1e0._32_8_;
    uVar307 = SUB168(auVar124 * auVar240,0);
    auVar125._8_8_ = 0;
    auVar125._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar123 * auVar239 + auVar122 * auVar238 + auVar125 * ZEXT816(0x1000003d10);
    uVar310 = auVar2._0_8_;
    psStack_318 = (secp256k1_gej *)(uVar310 & 0xfffffffffffff);
    auVar296._8_8_ = 0;
    auVar296._0_8_ = uVar310 >> 0x34 | auVar2._8_8_ << 0xc;
    psVar314 = (secp256k1_gej *)(auStack_1e0._32_8_ * 2);
    auVar126._8_8_ = 0;
    auVar126._0_8_ = auStack_1e0._0_8_;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = psVar314;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = auStack_1e0._8_8_ * 2;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = auStack_1e0._24_8_;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = auStack_1e0._16_8_;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = auStack_1e0._16_8_;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar307 >> 0x34 | SUB168(auVar124 * auVar240,8) << 0xc;
    auVar2 = auVar126 * auVar241 + auVar296 + auVar127 * auVar242 + auVar128 * auVar243 +
             auVar129 * ZEXT816(0x1000003d10);
    uVar307 = auVar2._0_8_;
    auVar297._8_8_ = 0;
    auVar297._0_8_ = uVar307 >> 0x34 | auVar2._8_8_ << 0xc;
    uStack_1e8 = (uVar307 & 0xfffffffffffff) >> 0x30;
    a_00 = (secp256k1_gej *)(uVar307 & 0xffffffffffff);
    auVar130._8_8_ = 0;
    auVar130._0_8_ = auStack_1e0._0_8_;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = auStack_1e0._0_8_;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = auStack_1e0._8_8_;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = psVar314;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auStack_1e0._16_8_ * 2;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = auStack_1e0._24_8_;
    auVar2 = auVar131 * auVar245 + auVar297 + auVar132 * auVar246;
    uVar307 = auVar2._0_8_;
    auVar299._8_8_ = 0;
    auVar299._0_8_ = uVar307 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = (uVar307 & 0xfffffffffffff) << 4 | uStack_1e8;
    auVar2 = auVar130 * auVar244 + ZEXT816(0x1000003d1) * auVar247;
    uVar307 = auVar2._0_8_;
    (psStack_388->x).n[0] = uVar307 & 0xfffffffffffff;
    auVar298._8_8_ = 0;
    auVar298._0_8_ = uVar307 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = auStack_1e0._0_8_ * 2;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = auStack_1e0._8_8_;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = auStack_1e0._16_8_;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = psVar314;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = auStack_1e0._24_8_;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = auStack_1e0._24_8_;
    auVar3 = auVar134 * auVar249 + auVar299 + auVar135 * auVar250;
    uVar307 = auVar3._0_8_;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar133 * auVar248 + auVar298 + auVar136 * ZEXT816(0x1000003d10);
    uVar310 = auVar2._0_8_;
    auVar301._8_8_ = 0;
    auVar301._0_8_ = uVar307 >> 0x34 | auVar3._8_8_ << 0xc;
    (psStack_388->x).n[1] = uVar310 & 0xfffffffffffff;
    auVar300._8_8_ = 0;
    auVar300._0_8_ = uVar310 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = auStack_1e0._0_8_ * 2;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = auStack_1e0._16_8_;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = auStack_1e0._8_8_;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = auStack_1e0._8_8_;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = auStack_1e0._24_8_;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = psVar314;
    auVar301 = auVar139 * auVar253 + auVar301;
    uVar307 = auVar301._0_8_;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = uVar307 & 0xfffffffffffff;
    auVar2 = auVar137 * auVar251 + auVar300 + auVar138 * auVar252 + auVar140 * ZEXT816(0x1000003d10)
    ;
    uVar310 = auVar2._0_8_;
    (psStack_388->x).n[2] = uVar310 & 0xfffffffffffff;
    auVar302._8_8_ = 0;
    auVar302._0_8_ = (long)(psStack_318->x).n + (uVar310 >> 0x34 | auVar2._8_8_ << 0xc);
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uVar307 >> 0x34 | auVar301._8_8_ << 0xc;
    auVar302 = auVar141 * ZEXT816(0x1000003d10) + auVar302;
    uVar307 = auVar302._0_8_;
    (psStack_388->x).n[3] = uVar307 & 0xfffffffffffff;
    (psStack_388->x).n[4] = (long)(a_00->x).n + (uVar307 >> 0x34 | auVar302._8_8_ << 0xc);
    (psStack_388->x).magnitude = 1;
    (psStack_388->x).normalized = 0;
    psStack_398 = (secp256k1_gej *)0x124c29;
    psStack_320 = a_00;
    secp256k1_fe_verify(&psStack_388->x);
    psStack_398 = (secp256k1_gej *)0x124c31;
    secp256k1_fe_verify(&psVar317->x);
    psVar313 = (secp256k1_gej *)auStack_310;
    psStack_398 = (secp256k1_gej *)0x124c41;
    r = psVar313;
    secp256k1_fe_verify((secp256k1_fe *)psVar313);
    iVar306 = auStack_310._40_4_ + (psVar317->x).magnitude;
    if (0x20 < iVar306) goto LAB_00124f76;
    uVar303 = (psVar317->x).n[1];
    uVar304 = (psVar317->x).n[2];
    uVar305 = (psVar317->x).n[3];
    (psVar317->x).n[0] = (psVar317->x).n[0] + auStack_310._0_8_;
    (psVar317->x).n[1] = uVar303 + auStack_310._8_8_;
    (psVar317->x).n[2] = uVar304 + auStack_310._16_8_;
    (psVar317->x).n[3] = uVar305 + auStack_310._24_8_;
    puVar1 = (psVar317->x).n + 4;
    *puVar1 = *puVar1 + auStack_310._32_8_;
    (psVar317->x).magnitude = iVar306;
    (psVar317->x).normalized = 0;
    psStack_398 = (secp256k1_gej *)0x124c99;
    secp256k1_fe_verify(&psVar317->x);
    psStack_398 = (secp256k1_gej *)0x124ca1;
    secp256k1_fe_verify(&psVar317->x);
    psVar313 = (secp256k1_gej *)(auStack_250 + 0x30);
    psStack_398 = (secp256k1_gej *)0x124cb1;
    r = psVar313;
    secp256k1_fe_verify((secp256k1_fe *)psVar313);
    iVar306 = iStack_1f8 + (psVar317->x).magnitude;
    if (0x20 < iVar306) goto LAB_00124f7b;
    uVar303 = (psVar317->x).n[1];
    uVar304 = (psVar317->x).n[2];
    uVar305 = (psVar317->x).n[3];
    psVar313 = (secp256k1_gej *)(auStack_250 + 0x30);
    (psVar317->x).n[0] = (psVar317->x).n[0] + auStack_250._48_8_;
    (psVar317->x).n[1] = uVar303 + uStack_218;
    (psVar317->x).n[2] = uVar304 + uStack_210;
    (psVar317->x).n[3] = uVar305 + uStack_208;
    puVar1 = (psVar317->x).n + 4;
    *puVar1 = *puVar1 + uStack_200;
    (psVar317->x).magnitude = iVar306;
    (psVar317->x).normalized = 0;
    psStack_398 = (secp256k1_gej *)0x124d04;
    secp256k1_fe_verify(&psVar317->x);
    psStack_398 = (secp256k1_gej *)0x124d0c;
    secp256k1_fe_verify(&psVar317->x);
    psStack_398 = (secp256k1_gej *)0x124d14;
    r = psVar313;
    secp256k1_fe_verify((secp256k1_fe *)psVar313);
    iVar306 = iStack_1f8 + (psVar317->x).magnitude;
    if (0x20 < iVar306) goto LAB_00124f80;
    uVar303 = (psVar317->x).n[1];
    uVar304 = (psVar317->x).n[2];
    uVar305 = (psVar317->x).n[3];
    psVar313 = (secp256k1_gej *)(auStack_250 + 0x30);
    (psVar317->x).n[0] = (psVar317->x).n[0] + auStack_250._48_8_;
    (psVar317->x).n[1] = uVar303 + uStack_218;
    (psVar317->x).n[2] = uVar304 + uStack_210;
    (psVar317->x).n[3] = uVar305 + uStack_208;
    puVar1 = (psVar317->x).n + 4;
    *puVar1 = *puVar1 + uStack_200;
    (psVar317->x).magnitude = iVar306;
    (psVar317->x).normalized = 0;
    psStack_398 = (secp256k1_gej *)0x124d67;
    secp256k1_fe_verify(&psVar317->x);
    psStack_398 = (secp256k1_gej *)0x124d6f;
    secp256k1_fe_verify((secp256k1_fe *)psVar313);
    psStack_398 = (secp256k1_gej *)0x124d77;
    r = psVar317;
    secp256k1_fe_verify(&psVar317->x);
    iVar306 = (psVar317->x).magnitude + iStack_1f8;
    if (iVar306 < 0x21) {
      auStack_250._48_8_ = (psVar317->x).n[0] + auStack_250._48_8_;
      uStack_218 = (psVar317->x).n[1] + uStack_218;
      uStack_210 = (psVar317->x).n[2] + uStack_210;
      uStack_208 = (psVar317->x).n[3] + uStack_208;
      uStack_200 = uStack_200 + (psVar317->x).n[4];
      iStack_1f4 = 0;
      psStack_398 = (secp256k1_gej *)0x124dcc;
      iStack_1f8 = iVar306;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_250 + 0x30));
      psVar313 = (secp256k1_gej *)&psVar317->y;
      psStack_398 = (secp256k1_gej *)0x124de3;
      secp256k1_fe_mul((secp256k1_fe *)psVar313,(secp256k1_fe *)(auStack_250 + 0x30),
                       (secp256k1_fe *)auStack_1e0);
      psVar314 = (secp256k1_gej *)auStack_310;
      psStack_398 = (secp256k1_gej *)0x124dfe;
      a_00 = psVar314;
      secp256k1_fe_mul((secp256k1_fe *)psVar314,(secp256k1_fe *)psVar314,
                       (secp256k1_fe *)(auStack_310 + 0x30));
      psStack_398 = (secp256k1_gej *)0x124e06;
      secp256k1_fe_verify((secp256k1_fe *)psVar313);
      psStack_398 = (secp256k1_gej *)0x124e0e;
      r = psVar314;
      secp256k1_fe_verify((secp256k1_fe *)psVar314);
      iVar306 = auStack_310._40_4_ + (psVar317->y).magnitude;
      if (iVar306 < 0x21) {
        uVar303 = (psVar317->y).n[1];
        uVar304 = (psVar317->y).n[2];
        uVar305 = (psVar317->y).n[3];
        (psVar317->y).n[0] = (psVar317->y).n[0] + auStack_310._0_8_;
        (psVar317->y).n[1] = uVar303 + auStack_310._8_8_;
        (psVar317->y).n[2] = uVar304 + auStack_310._16_8_;
        (psVar317->y).n[3] = uVar305 + auStack_310._24_8_;
        puVar1 = (psVar317->y).n + 4;
        *puVar1 = *puVar1 + auStack_310._32_8_;
        (psVar317->y).magnitude = iVar306;
        (psVar317->y).normalized = 0;
        psStack_398 = (secp256k1_gej *)0x124e69;
        secp256k1_fe_verify((secp256k1_fe *)psVar313);
        psStack_398 = (secp256k1_gej *)0x124e71;
        secp256k1_gej_verify(psVar317);
        return extraout_EAX;
      }
      goto LAB_00124f8a;
    }
  }
  else {
    psStack_398 = (secp256k1_gej *)0x124f4e;
    secp256k1_gej_add_var_cold_14();
LAB_00124f4e:
    psStack_398 = (secp256k1_gej *)0x124f53;
    secp256k1_gej_add_var_cold_13();
LAB_00124f53:
    psStack_398 = (secp256k1_gej *)0x124f58;
    secp256k1_gej_add_var_cold_12();
LAB_00124f58:
    psStack_398 = (secp256k1_gej *)0x124f5d;
    secp256k1_gej_add_var_cold_11();
LAB_00124f5d:
    psStack_398 = (secp256k1_gej *)0x124f62;
    secp256k1_gej_add_var_cold_10();
LAB_00124f62:
    psStack_398 = (secp256k1_gej *)0x124f67;
    secp256k1_gej_add_var_cold_9();
LAB_00124f67:
    psVar319 = psVar318;
    psVar315 = psVar317;
    psStack_398 = (secp256k1_gej *)0x124f6c;
    secp256k1_gej_add_var_cold_8();
LAB_00124f6c:
    psStack_398 = (secp256k1_gej *)0x124f71;
    secp256k1_gej_add_var_cold_7();
LAB_00124f71:
    psVar317 = r_00;
    psVar320 = psVar319;
    psVar318 = psVar315;
    psStack_398 = (secp256k1_gej *)0x124f76;
    secp256k1_gej_add_var_cold_6();
LAB_00124f76:
    psStack_398 = (secp256k1_gej *)0x124f7b;
    secp256k1_gej_add_var_cold_5();
LAB_00124f7b:
    psStack_398 = (secp256k1_gej *)0x124f80;
    secp256k1_gej_add_var_cold_4();
LAB_00124f80:
    psStack_398 = (secp256k1_gej *)0x124f85;
    secp256k1_gej_add_var_cold_3();
  }
  psStack_398 = (secp256k1_gej *)0x124f8a;
  secp256k1_gej_add_var_cold_2();
LAB_00124f8a:
  psStack_398 = (secp256k1_gej *)secp256k1_ecmult_compute_table;
  secp256k1_gej_add_var_cold_1();
  psStack_3b8 = psVar313;
  psStack_3b0 = psVar318;
  psStack_3a8 = psVar320;
  psStack_3a0 = psVar314;
  psStack_398 = psVar317;
  memcpy(&sStack_450,a_00,0x98);
  secp256k1_ge_set_gej_var(&sStack_4b8,&sStack_450);
  secp256k1_ge_to_storage((secp256k1_ge_storage *)r,&sStack_4b8);
  secp256k1_gej_double_var(&sStack_450,a_00,(secp256k1_fe *)0x0);
  secp256k1_ge_set_gej_var(&sStack_520,&sStack_450);
  lVar321 = 0x40;
  do {
    secp256k1_gej_set_ge(&sStack_450,&sStack_4b8);
    secp256k1_gej_add_ge_var(&sStack_450,&sStack_450,&sStack_520,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var(&sStack_4b8,&sStack_450);
    secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)(r->x).n + lVar321),&sStack_4b8);
    lVar321 = lVar321 + 0x40;
  } while (lVar321 != 0x100);
  return extraout_EAX_02;
}

Assistant:

static int secp256k1_ge_x_frac_on_curve_var(const secp256k1_fe *xn, const secp256k1_fe *xd) {
    /* We want to determine whether (xn/xd) is on the curve.
     *
     * (xn/xd)^3 + 7 is square <=> xd*xn^3 + 7*xd^4 is square (multiplying by xd^4, a square).
     */
     secp256k1_fe r, t;
#ifdef VERIFY
     VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(xd));
#endif
     secp256k1_fe_mul(&r, xd, xn); /* r = xd*xn */
     secp256k1_fe_sqr(&t, xn); /* t = xn^2 */
     secp256k1_fe_mul(&r, &r, &t); /* r = xd*xn^3 */
     secp256k1_fe_sqr(&t, xd); /* t = xd^2 */
     secp256k1_fe_sqr(&t, &t); /* t = xd^4 */
     VERIFY_CHECK(SECP256K1_B <= 31);
     secp256k1_fe_mul_int(&t, SECP256K1_B); /* t = 7*xd^4 */
     secp256k1_fe_add(&r, &t); /* r = xd*xn^3 + 7*xd^4 */
     return secp256k1_fe_is_square_var(&r);
}